

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

size_t perfetto::
       TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
       ::Get<>(EventContext *ctx,char **value)

{
  bool bVar1;
  InternedData *interned_data;
  EventContext *local_30;
  size_t iid;
  InternedDebugAnnotationValueTypeName *index_for_field;
  char **value_local;
  EventContext *ctx_local;
  
  index_for_field = (InternedDebugAnnotationValueTypeName *)value;
  value_local = (char **)ctx;
  iid = (size_t)GetOrCreateIndexForField(ctx->incremental_state_);
  bVar1 = SmallInternedDataTraits::Index<const_char_*>::LookUpOrInsert
                    (&(((InternedDebugAnnotationValueTypeName *)iid)->
                      super_TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
                      ).index_,(size_t *)&local_30,(char **)index_for_field);
  if (bVar1) {
    ctx_local = local_30;
  }
  else {
    interned_data =
         protozero::HeapBuffered<perfetto::protos::pbzero::InternedData>::get
                   ((HeapBuffered<perfetto::protos::pbzero::InternedData> *)(value_local[2] + 8));
    internal::InternedDebugAnnotationValueTypeName::Add
              (interned_data,(size_t)local_30,
               (char *)(index_for_field->
                       super_TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
                       ).super_BaseTrackEventInternedDataIndex._vptr_BaseTrackEventInternedDataIndex
              );
    ctx_local = local_30;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t Get(EventContext* ctx,
                    const ValueType& value,
                    Args&&... add_args) {
    // First check if the value exists in the dictionary.
    auto index_for_field = GetOrCreateIndexForField(ctx->incremental_state_);
    size_t iid;
    if (PERFETTO_LIKELY(index_for_field->index_.LookUpOrInsert(&iid, value))) {
      PERFETTO_DCHECK(iid);
      return iid;
    }

    // If not, we need to serialize the definition of the interned value into
    // the heap buffered message (which is committed to the trace when the
    // packet ends).
    PERFETTO_DCHECK(iid);
    InternedDataType::Add(
        ctx->incremental_state_->serialized_interned_data.get(), iid,
        std::move(value), std::forward<Args>(add_args)...);
    return iid;
  }